

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_color nk_rgba_hex(char *rgb)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int in_ESI;
  ulong uVar5;
  
  uVar5 = (ulong)(*rgb == '#');
  uVar1 = nk_parse_hex(rgb + uVar5,in_ESI);
  uVar2 = nk_parse_hex(rgb + uVar5 + 2,in_ESI);
  uVar3 = nk_parse_hex(rgb + uVar5 + 4,in_ESI);
  iVar4 = nk_parse_hex(rgb + uVar5 + 6,in_ESI);
  return (nk_color)(iVar4 << 0x18 | (uVar3 & 0xff) << 0x10 | (uVar2 & 0xff) << 8 | uVar1 & 0xff);
}

Assistant:

NK_API struct nk_color
nk_rgba_hex(const char *rgb)
{
    struct nk_color col;
    const char *c = rgb;
    if (*c == '#') c++;
    col.r = (nk_byte)nk_parse_hex(c, 2);
    col.g = (nk_byte)nk_parse_hex(c+2, 2);
    col.b = (nk_byte)nk_parse_hex(c+4, 2);
    col.a = (nk_byte)nk_parse_hex(c+6, 2);
    return col;
}